

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

Cnf_Dat_t * Jf_ManCreateCnf(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *pCVar4;
  int **ppiVar5;
  long lVar6;
  int *piVar7;
  int *__s;
  uint uVar8;
  size_t __size;
  
  pCVar4 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar4->pMan = (Aig_Man_t *)p;
  pCVar4->nVars = p->nObjs;
  iVar1 = vLits->nSize;
  pCVar4->nLiterals = iVar1;
  iVar2 = vClas->nSize;
  pCVar4->nClauses = iVar2;
  ppiVar5 = (int **)malloc((long)iVar2 * 8 + 8);
  pCVar4->pClauses = ppiVar5;
  piVar7 = vLits->pArray;
  vLits->nCap = 0;
  vLits->nSize = 0;
  vLits->pArray = (int *)0x0;
  *ppiVar5 = piVar7;
  iVar3 = vClas->nSize;
  if ((long)iVar3 < 1) {
    lVar6 = 0;
  }
  else {
    piVar7 = vClas->pArray;
    lVar6 = 0;
    do {
      ppiVar5[lVar6] = *ppiVar5 + piVar7[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar3 != lVar6);
  }
  ppiVar5[lVar6] = *ppiVar5 + iVar1;
  __size = (long)p->nObjs << 2;
  piVar7 = (int *)malloc(__size);
  memset(piVar7,0xff,__size);
  pCVar4->pObj2Clause = piVar7;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  pCVar4->pObj2Count = __s;
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      if (*ppiVar5[lVar6] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar8 = (uint)*ppiVar5[lVar6] >> 1;
      if (piVar7[uVar8] == -1) {
        piVar7[uVar8] = (int)lVar6;
        __s[uVar8] = 1;
      }
      else {
        if (__s[uVar8] < 1) {
          __assert_fail("pCnf->pObj2Count[iOut] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                        ,0xe2,"Cnf_Dat_t *Jf_ManCreateCnf(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        __s[uVar8] = __s[uVar8] + 1;
      }
      lVar6 = lVar6 + 1;
    } while (iVar2 != lVar6);
  }
  return pCVar4;
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnf( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas )
{
    Cnf_Dat_t * pCnf; 
    int i, Entry, iOut;
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = Gia_ManObjNum(p);
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    // create mapping of objects into their clauses
    pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        iOut = Abc_Lit2Var(pCnf->pClauses[i][0]);
        if ( pCnf->pObj2Clause[iOut] == -1 )
        {
            pCnf->pObj2Clause[iOut] = i;
            pCnf->pObj2Count[iOut] = 1;
        }
        else
        {
            assert( pCnf->pObj2Count[iOut] > 0 );
            pCnf->pObj2Count[iOut]++;
        }
    }
    return pCnf;
}